

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v11::detail::vformat_to(buffer<char> *buf,string_view fmt,format_args args,locale_ref loc)

{
  undefined1 x [16];
  undefined1 value [16];
  undefined1 x_00 [16];
  undefined1 value_00 [16];
  format_args args_00;
  basic_string_view<char> fmt_00;
  custom_value<fmt::v11::context> custom;
  bool bVar1;
  size_t sVar2;
  char *lhs;
  format_handler<char> *handler;
  basic_string_view<char> fmt_01;
  unkbyte10 in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe32;
  parse_context<char> local_158;
  context cStack_140;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_120;
  char *local_118;
  default_arg_formatter<char> local_110;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 local_108;
  undefined4 local_f8;
  basic_appender<char> local_e8;
  appender out;
  buffer<char> *buf_local;
  locale_ref loc_local;
  format_args args_local;
  string_view fmt_local;
  custom_value<fmt::v11::context> local_98;
  basic_string_view<char> local_88;
  uint128_opt *local_78;
  uint128_opt *local_68;
  int128_opt *local_48;
  int128_opt *local_38;
  default_arg_formatter<char> *local_18;
  anon_union_16_16_d721ec3a_for_value<fmt::v11::context>_1 *local_10;
  
  args_local.desc_ = (unsigned_long_long)args.field_1;
  loc_local.locale_ = (void *)args.desc_;
  fmt_local.data_ = (char *)fmt.size_;
  args_local.field_1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)fmt.data_
  ;
  out.container = buf;
  basic_appender<char>::basic_appender(&local_e8,buf);
  sVar2 = basic_string_view<char>::size((basic_string_view<char> *)&args_local.field_1);
  if (sVar2 == 2) {
    lhs = basic_string_view<char>::data((basic_string_view<char> *)&args_local.field_1);
    bVar1 = equal2(lhs,"{}");
    if (bVar1) {
      basic_format_args<fmt::v11::context>::get
                ((format_arg *)&local_108.string,(basic_format_args<fmt::v11::context> *)&loc_local,
                 0);
      local_110.out.container = (basic_appender<char>)(basic_appender<char>)local_e8.container;
      local_18 = &local_110;
      local_10 = &local_108;
      switch(local_f8) {
      case 0:
        break;
      case 1:
        default_arg_formatter<char>::operator()<int,_0>(&local_110,local_108.int_value);
        return;
      case 2:
        default_arg_formatter<char>::operator()<unsigned_int,_0>(&local_110,local_108.uint_value);
        return;
      case 3:
        default_arg_formatter<char>::operator()<long_long,_0>
                  (&local_110,CONCAT44(local_108.long_long_value._4_4_,local_108.int_value));
        return;
      case 4:
        default_arg_formatter<char>::operator()<unsigned_long_long,_0>
                  (&local_110,CONCAT44(local_108.long_long_value._4_4_,local_108.int_value));
        return;
      case 5:
        x._10_6_ = in_stack_fffffffffffffe32;
        x._0_10_ = in_stack_fffffffffffffe28;
        local_48 = map((int128_opt *)CONCAT44(local_108.long_long_value._4_4_,local_108.int_value),
                       (int128_opt)x);
        value._10_6_ = in_stack_fffffffffffffe32;
        value._0_10_ = in_stack_fffffffffffffe28;
        local_38 = local_48;
        default_arg_formatter<char>::operator()<__int128,_0>(&local_110,(__int128)value);
        return;
      case 6:
        x_00._10_6_ = in_stack_fffffffffffffe32;
        x_00._0_10_ = in_stack_fffffffffffffe28;
        local_78 = map((uint128_opt *)CONCAT44(local_108.long_long_value._4_4_,local_108.int_value),
                       (uint128_opt)x_00);
        value_00._10_6_ = in_stack_fffffffffffffe32;
        value_00._0_10_ = in_stack_fffffffffffffe28;
        local_68 = local_78;
        default_arg_formatter<char>::operator()<unsigned___int128,_0>
                  (&local_110,(unsigned___int128)value_00);
        return;
      case 7:
        default_arg_formatter<char>::operator()<bool,_0>
                  (&local_110,(bool)(local_108.char_value & 1));
        return;
      case 8:
        default_arg_formatter<char>::operator()<char,_0>(&local_110,local_108.char_value);
        return;
      case 9:
        default_arg_formatter<char>::operator()<float,_0>(&local_110,local_108.float_value);
        return;
      case 10:
        default_arg_formatter<char>::operator()<double,_0>
                  (&local_110,(double)CONCAT44(local_108.long_long_value._4_4_,local_108.int_value))
        ;
        return;
      case 0xb:
        default_arg_formatter<char>::operator()<long_double,_0>
                  (&local_110,
                   (longdouble)
                   CONCAT28(local_108.int128_value._8_2_,
                            CONCAT44(local_108.long_long_value._4_4_,local_108.int_value)));
        return;
      case 0xc:
        default_arg_formatter<char>::operator()<const_char_*,_0>
                  (&local_110,(char *)CONCAT44(local_108.long_long_value._4_4_,local_108.int_value))
        ;
        return;
      case 0xd:
        local_88 = string_value<char>::str(&local_108.string);
        default_arg_formatter<char>::operator()<fmt::v11::basic_string_view<char>,_0>
                  (&local_110,local_88);
        return;
      case 0xe:
        default_arg_formatter<char>::operator()<const_void_*,_0>
                  (&local_110,(void *)CONCAT44(local_108.long_long_value._4_4_,local_108.int_value))
        ;
        return;
      case 0xf:
        custom.value._4_4_ = local_108.long_long_value._4_4_;
        custom.value._0_4_ = local_108.int_value;
        custom.format._0_2_ = local_108.int128_value._8_2_;
        custom.format._2_6_ = local_108.int128_value._10_6_;
        basic_format_arg<fmt::v11::context>::handle::handle((handle *)&local_98,custom);
        default_arg_formatter<char>::operator()(&local_110,(handle)local_98);
        return;
      }
      monostate::monostate((monostate *)((long)&fmt_local.size_ + 7));
      default_arg_formatter<char>::operator()(&local_110);
      return;
    }
  }
  local_120 = args_local.field_1;
  local_118 = fmt_local.data_;
  fmt_00.size_ = (size_t)fmt_local.data_;
  fmt_00.data_ = (char *)args_local.field_1.values_;
  parse_context<char>::parse_context(&local_158,fmt_00,0);
  args_00.field_1 =
       (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)args_local.desc_;
  args_00.desc_ = (unsigned_long_long)loc_local.locale_;
  handler = (format_handler<char> *)args_local.desc_;
  v11::context::context(&cStack_140,(iterator)local_e8.container,args_00,loc);
  fmt_01.size_ = (size_t)&local_158;
  fmt_01.data_ = local_118;
  parse_format_string<char,fmt::v11::detail::format_handler<char>>
            ((detail *)local_120.values_,fmt_01,handler);
  return;
}

Assistant:

FMT_FUNC void vformat_to(buffer<char>& buf, string_view fmt, format_args args,
                         locale_ref loc) {
  auto out = appender(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}"))
    return args.get(0).visit(default_arg_formatter<char>{out});
  parse_format_string(
      fmt, format_handler<char>{parse_context<char>(fmt), {out, args, loc}});
}